

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O0

char * __thiscall
google::protobuf::internal::
PackedEnumParserArg<std::__cxx11::string,google::protobuf::internal::ExtensionInfo::EnumValidityCheck>
          (internal *this,void *object,char *ptr,ParseContext *ctx,EnumValidityCheck validator,
          InternalMetadata *metadata,int field_num)

{
  anon_class_40_4_e7654817 add;
  char *pcVar1;
  undefined4 uStack_3c;
  InternalMetadata *metadata_local;
  ParseContext *ctx_local;
  char *ptr_local;
  void *object_local;
  EnumValidityCheck validator_local;
  
  add._36_4_ = uStack_3c;
  add.field_num = metadata._0_4_;
  add.validator.func = (EnumValidityFuncWithArg *)ctx;
  add.object = this;
  add.validator.arg = validator.func;
  add.metadata = (InternalMetadata *)validator.arg;
  pcVar1 = EpsCopyInputStream::
           ReadPackedVarint<google::protobuf::internal::PackedEnumParserArg<std::__cxx11::string,google::protobuf::internal::ExtensionInfo::EnumValidityCheck>(void*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::ExtensionInfo::EnumValidityCheck,google::protobuf::internal::InternalMetadata*,int)::_lambda(int)_1_>
                     ((EpsCopyInputStream *)ptr,(char *)object,add);
  return pcVar1;
}

Assistant:

[[nodiscard]] const char* PackedEnumParserArg(void* object, const char* ptr,
                                              ParseContext* ctx,
                                              Validator validator,
                                              InternalMetadata* metadata,
                                              int field_num) {
  return ctx->ReadPackedVarint(
      ptr, [object, validator, metadata, field_num](int32_t val) {
        if (validator.IsValid(val)) {
          static_cast<RepeatedField<int>*>(object)->Add(val);
        } else {
          WriteVarint(field_num, val, metadata->mutable_unknown_fields<T>());
        }
      });
}